

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<kj::String>::setCapacity(Vector<kj::String> *this,size_t newSize)

{
  String *pSVar1;
  RemoveConst<kj::String> *pRVar2;
  ulong uVar3;
  String *pSVar4;
  __off_t in_RDX;
  ArrayBuilder<kj::String> local_38;
  
  uVar3 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 3) * -0x5555555555555555;
  if (newSize <= uVar3 && uVar3 - newSize != 0) {
    ArrayBuilder<kj::String>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (String *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x18,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pSVar4 = (this->builder).ptr; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    ((local_38.pos)->content).ptr = (pSVar4->content).ptr;
    ((local_38.pos)->content).size_ = (pSVar4->content).size_;
    ((local_38.pos)->content).disposer = (pSVar4->content).disposer;
    local_38.pos = local_38.pos + 1;
    (pSVar4->content).ptr = (char *)0x0;
    (pSVar4->content).size_ = 0;
  }
  ArrayBuilder<kj::String>::operator=(&this->builder,&local_38);
  pSVar1 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pSVar4 = local_38.ptr;
  if (local_38.ptr != (String *)0x0) {
    local_38.ptr = (String *)0x0;
    local_38.pos = (RemoveConst<kj::String> *)0x0;
    local_38.endPtr = (String *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pSVar4,0x18,
               ((long)pRVar2 - (long)pSVar4 >> 3) * -0x5555555555555555,
               ((long)pSVar1 - (long)pSVar4 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }